

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action.hpp
# Opt level: O0

bool __thiscall
boost::spirit::karma::
action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<8>,(boost::spirit::endian::endianness)2,8>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::argument<0>>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<coapi::code_registry>>,0l>>>,2l>>>
::
generate<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type>
          (action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<8>,(boost::spirit::endian::endianness)2,8>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::argument<0>>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<coapi::code_registry>>,0l>>>,2l>>>
           *this,output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
                 *sink,unused_type *ctx,unused_type *d,unused_type *attr_)

{
  bool bVar1;
  type puVar2;
  bool local_35;
  action_dispatch<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<8>,(boost::spirit::endian::endianness)2,8>>
  local_34 [2];
  uchar local_32;
  uchar local_31;
  unused_type *puStack_30;
  type_conflict attr;
  unused_type *attr__local;
  unused_type *d_local;
  unused_type *ctx_local;
  output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
  *sink_local;
  action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<8>,_(boost::spirit::endian::endianness)2,_8>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::argument<0>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<coapi::code_registry>_>,_0L>_>_>,_2L>_>_>
  *this_local;
  
  puStack_30 = attr_;
  attr__local = d;
  d_local = ctx;
  ctx_local = (unused_type *)sink;
  sink_local = (output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
                *)this;
  local_32 = traits::make_attribute<unsigned_char,_boost::spirit::unused_type>::call();
  puVar2 = traits::pre_transform<boost::spirit::karma::domain,unsigned_char,unsigned_char>
                     (&local_32);
  local_31 = *puVar2;
  bVar1 = traits::
          action_dispatch<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<8>,(boost::spirit::endian::endianness)2,8>>
          ::operator()(local_34,(actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::argument<0>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<coapi::code_registry>_>,_0L>_>_>,_2L>_>
                                 *)(this + 8),&local_31,d_local);
  local_35 = false;
  if (bVar1) {
    local_35 = any_binary_generator<boost::spirit::karma::detail::integer<8>,(boost::spirit::endian::endianness)2,8>
               ::
               generate<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,unsigned_char>
                         ((output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
                           *)ctx_local,d_local,attr__local,&local_31);
  }
  return local_35;
}

Assistant:

bool generate(OutputIterator& sink, Context& ctx, Delimiter const& d
          , Attribute const& attr_) const
        {
            typedef typename attribute<Context, unused_type>::type attr_type;
            typedef traits::make_attribute<attr_type, Attribute> make_attribute;

            // create a attribute if none is supplied
            // this creates a _copy_ of the attribute because the semantic
            // action will likely change parts of this
            typedef traits::transform_attribute<
                typename make_attribute::type, attr_type, domain> transform;

            typename transform::type attr = 
                traits::pre_transform<domain, attr_type>(make_attribute::call(attr_));

            // call the function, passing the attribute, the context and a bool 
            // flag that the client can set to false to fail generating.
            return traits::action_dispatch<Subject>()(f, attr, ctx) && 
                   subject.generate(sink, ctx, d, attr);
        }